

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cda-bench.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  clock_t cVar2;
  clock_t cVar3;
  long lVar4;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_unique_ptr<LLVMControlDependenceAnalysis,_default_delete<LLVMControlDependenceAnalysis>_>,_unsigned_long>_>
  *p_Var5;
  ostream *poVar6;
  __tuple_element_t<2UL,_tuple<basic_string<char>,_unique_ptr<LLVMControlDependenceAnalysis,_default_delete<LLVMControlDependenceAnalysis>_>,_unsigned_long>_>
  *p_Var7;
  ulong uVar8;
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *pvVar9;
  char **in_RSI;
  uint in_EDI;
  uint m;
  Value *d_1;
  iterator __end5;
  iterator __begin5;
  ValVec *__range5;
  Instruction *I;
  iterator __end4_1;
  iterator __begin4_1;
  BasicBlock *__range4_1;
  Value *d;
  iterator __end4;
  iterator __begin4;
  ValVec *__range4;
  BasicBlock *B;
  iterator __end3;
  iterator __begin3;
  Function *__range3;
  LLVMControlDependenceAnalysis *cda;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it_2;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  *__range2_3;
  uint n;
  vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
  results;
  Function *F_2;
  iterator __end1_1;
  iterator __begin1_1;
  Module *__range1_1;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  *__range2_2;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *it;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  *__range2_1;
  Function *F_1;
  iterator __end1;
  iterator __begin1;
  Module *__range1;
  LLVMControlDependenceAnalysisOptions *opts;
  clock_t elapsed;
  clock_t end;
  clock_t start;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  analyses;
  Function *F;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> M;
  LLVMContext context;
  SlicerOptions options;
  Module *in_stack_fffffffffffffa68;
  SlicerOptions *in_stack_fffffffffffffa70;
  LLVMControlDependenceAnalysis *in_stack_fffffffffffffa78;
  vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *in_stack_fffffffffffffa80;
  ostream *in_stack_fffffffffffffa88;
  ostream *in_stack_fffffffffffffa90;
  float local_55c;
  uint local_544;
  LLVMControlDependenceAnalysisOptions *in_stack_fffffffffffffae0;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  in_stack_fffffffffffffae8;
  string local_510 [16];
  Function *in_stack_fffffffffffffb00;
  string *in_stack_fffffffffffffb08;
  reference in_stack_fffffffffffffb10;
  iterator in_stack_fffffffffffffb18;
  iterator in_stack_fffffffffffffb20;
  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
  local_4a8;
  undefined1 local_4a0 [24];
  undefined1 *local_488;
  reference local_480;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_478;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
  local_470;
  reference local_468;
  pointer local_460;
  reference local_458;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *local_450;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
  local_448;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  *local_440;
  uint local_434;
  vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
  local_430;
  reference local_418;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_410;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_408;
  type local_400;
  reference local_3f8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *local_3f0;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
  local_3e8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  *local_3e0;
  reference local_3d8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
  *local_3d0;
  __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
  local_3c8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  *local_3c0;
  reference local_3b8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_3b0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_3a8;
  type local_3a0;
  undefined4 local_394;
  undefined4 local_384;
  undefined4 local_374;
  undefined4 local_364;
  Function *in_stack_fffffffffffffca0;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
  local_2d8;
  reference local_2c0;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_2b8;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  local_2b0;
  type local_2a8;
  undefined4 local_29c;
  char local_298 [8];
  SlicerOptions local_290;
  char **local_10;
  uint local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  setupStackTraceOnError(in_EDI,in_RSI);
  parseSlicerOptions((int)&local_290 + 0x10,(char **)(ulong)local_8,SUB81(local_10,0),false);
  llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x12219c);
  bVar1 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x1221b7);
  if (bVar1) {
    local_290.dgOptions.PTAOptions.super_LLVMAnalysisOptions._15_1_ = 1;
    llvm::cl::opt<bool,false,llvm::cl::parser<bool>>::operator=
              ((opt<bool,_false,_llvm::cl::parser<bool>_> *)in_stack_fffffffffffffa70,
               (bool *)in_stack_fffffffffffffa68);
  }
  llvm::LLVMContext::LLVMContext((LLVMContext *)&local_290);
  parseModule(local_298,(LLVMContext *)"llvm-cda-bench",&local_290);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x122217);
  if (bVar1) {
    bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                      ((opt_storage<bool,_false,_false> *)0x122249);
    if (bVar1) {
      local_2a8 = std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator*
                            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
                             in_stack_fffffffffffffa70);
      local_2b0.NodePtr = (node_pointer)llvm::Module::begin(in_stack_fffffffffffffa68);
      local_2b8.NodePtr = (node_pointer)llvm::Module::end(in_stack_fffffffffffffa68);
      while (bVar1 = llvm::operator!=(&local_2b0,&local_2b8), bVar1) {
        local_2c0 = llvm::
                    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                    ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                                 *)0x1222b9);
        uVar8 = llvm::GlobalValue::isDeclaration();
        if ((uVar8 & 1) == 0) {
          dumpFunStats(in_stack_fffffffffffffca0);
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                      *)in_stack_fffffffffffffa70);
      }
      local_4 = 0;
      local_29c = 1;
    }
    else {
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ::vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                *)0x12231a);
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x122343);
      if (bVar1) {
        local_290.dgOptions.entryFunction = (string)0x0;
        local_290.dgOptions._377_3_ = 0;
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x122365);
        createAnalysis((Module *)in_stack_fffffffffffffae8._M_current,in_stack_fffffffffffffae0);
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa90,(char (*) [4])in_stack_fffffffffffffa88,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)in_stack_fffffffffffffa70);
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x1223cc);
      if (bVar1) {
        local_290.dgOptions.entryFunction = (string)0x5;
        local_290.dgOptions._377_3_ = 0;
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1223ee);
        createAnalysis((Module *)in_stack_fffffffffffffae8._M_current,in_stack_fffffffffffffae0);
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[6],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa90,(char (*) [6])in_stack_fffffffffffffa88,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)in_stack_fffffffffffffa70);
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x122455);
      if (bVar1) {
        local_290.dgOptions.entryFunction = (string)0x2;
        local_290.dgOptions._377_3_ = 0;
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x122477);
        createAnalysis((Module *)in_stack_fffffffffffffae8._M_current,in_stack_fffffffffffffae0);
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[7],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa90,(char (*) [7])in_stack_fffffffffffffa88,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)in_stack_fffffffffffffa70);
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x1224de);
      if (bVar1) {
        local_290.dgOptions.entryFunction = (string)0x3;
        local_290.dgOptions._377_3_ = 0;
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x122500);
        createAnalysis((Module *)in_stack_fffffffffffffae8._M_current,in_stack_fffffffffffffae0);
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[16],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa90,(char (*) [16])in_stack_fffffffffffffa88,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)in_stack_fffffffffffffa70);
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x122567);
      if (bVar1) {
        local_290.dgOptions.entryFunction = (string)0x4;
        local_290.dgOptions._377_3_ = 0;
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x122589);
        createAnalysis((Module *)in_stack_fffffffffffffae8._M_current,in_stack_fffffffffffffae0);
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[22],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa90,(char (*) [22])in_stack_fffffffffffffa88,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)in_stack_fffffffffffffa70);
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x1225f0);
      if (bVar1) {
        local_290.dgOptions.entryFunction = (string)0x1;
        local_290.dgOptions._377_3_ = 0;
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x122612);
        createAnalysis((Module *)in_stack_fffffffffffffae8._M_current,in_stack_fffffffffffffae0);
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[13],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa90,(char (*) [13])in_stack_fffffffffffffa88,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)in_stack_fffffffffffffa70);
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x122679);
      if (bVar1) {
        local_290.dgOptions.entryFunction = (string)0x7;
        local_290.dgOptions._377_3_ = 0;
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x12269b);
        createAnalysis((Module *)in_stack_fffffffffffffae8._M_current,in_stack_fffffffffffffae0);
        local_364 = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa90,(char (*) [4])in_stack_fffffffffffffa88,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)in_stack_fffffffffffffa70);
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x122702);
      if (bVar1) {
        local_290.dgOptions.entryFunction = (string)0x6;
        local_290.dgOptions._377_3_ = 0;
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x122724);
        createAnalysis((Module *)in_stack_fffffffffffffae8._M_current,in_stack_fffffffffffffae0);
        local_374 = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[14],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa90,(char (*) [14])in_stack_fffffffffffffa88,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)in_stack_fffffffffffffa70);
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x12278b);
      if (bVar1) {
        local_290.dgOptions.entryFunction = (string)0x8;
        local_290.dgOptions._377_3_ = 0;
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x1227ad);
        createAnalysis((Module *)in_stack_fffffffffffffae8._M_current,in_stack_fffffffffffffae0);
        local_384 = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[10],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa90,(char (*) [10])in_stack_fffffffffffffa88,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)in_stack_fffffffffffffa70);
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x122814);
      if (bVar1) {
        local_290.dgOptions.entryFunction = (string)0x9;
        local_290.dgOptions._377_3_ = 0;
        std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::get
                  ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)0x122836);
        createAnalysis((Module *)in_stack_fffffffffffffae8._M_current,in_stack_fffffffffffffae0);
        local_394 = 0;
        std::
        vector<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>,std::allocator<std::tuple<std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>>>
        ::
        emplace_back<char_const(&)[4],std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,int>
                  ((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffa90,(char (*) [4])in_stack_fffffffffffffa88,
                   (unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                    *)in_stack_fffffffffffffa80,(int *)in_stack_fffffffffffffa78);
        std::
        unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
        ::~unique_ptr((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                       *)in_stack_fffffffffffffa70);
      }
      bVar1 = std::
              vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
              ::empty((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                       *)in_stack_fffffffffffffa80);
      if (bVar1) {
        std::operator<<((ostream *)&std::cerr,
                        "Warning: No analysis to run specified, dumping just info about funs\n");
      }
      local_3a0 = std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator*
                            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
                             in_stack_fffffffffffffa70);
      local_3a8.NodePtr = (node_pointer)llvm::Module::begin(in_stack_fffffffffffffa68);
      local_3b0.NodePtr = (node_pointer)llvm::Module::end(in_stack_fffffffffffffa68);
      while (bVar1 = llvm::operator!=(&local_3a8,&local_3b0), bVar1) {
        local_3b8 = llvm::
                    ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                    ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                                 *)0x12291a);
        uVar8 = llvm::GlobalValue::isDeclaration();
        if ((uVar8 & 1) == 0) {
          bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                            ((opt_storage<bool,_false,_false> *)0x12294d);
          if (!bVar1) {
            dumpFunStats(in_stack_fffffffffffffca0);
            std::operator<<((ostream *)&std::cout,"Elapsed time: \n");
          }
          local_3c0 = &local_2d8;
          local_3c8._M_current =
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                *)std::
                  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                  ::begin((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                           *)in_stack_fffffffffffffa68);
          local_3d0 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                       *)std::
                         vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                         ::end((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                                *)in_stack_fffffffffffffa68);
          while (bVar1 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
                                     *)in_stack_fffffffffffffa70,
                                    (__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
                                     *)in_stack_fffffffffffffa68), bVar1) {
            local_3d8 = __gnu_cxx::
                        __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
                        ::operator*(&local_3c8);
            cVar2 = clock();
            std::
            get<1ul,std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>
                      ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                        *)0x1229f8);
            std::
            unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
            ::operator->((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                          *)0x122a00);
            dg::LLVMControlDependenceAnalysis::compute
                      ((LLVMControlDependenceAnalysis *)in_stack_fffffffffffffa70,
                       (Function *)in_stack_fffffffffffffa68);
            cVar3 = clock();
            lVar4 = cVar3 - cVar2;
            p_Var7 = std::
                     get<2ul,std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>
                               ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                 *)0x122a4f);
            *p_Var7 = lVar4 + *p_Var7;
            bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                              ((opt_storage<bool,_false,_false> *)0x122a6d);
            if (!bVar1) {
              poVar6 = std::operator<<((ostream *)&std::cout,"  ");
              p_Var5 = std::
                       get<0ul,std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>
                                 ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                   *)0x122a9a);
              poVar6 = std::operator<<(poVar6,(string *)p_Var5);
              poVar6 = std::operator<<(poVar6,": ");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,(float)lVar4 / 1e+06);
              poVar6 = std::operator<<(poVar6," s (");
              poVar6 = (ostream *)std::ostream::operator<<(poVar6,lVar4);
              std::operator<<(poVar6," ticks)\n");
            }
            __gnu_cxx::
            __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
            ::operator++(&local_3c8);
          }
          bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                            ((opt_storage<bool,_false,_false> *)0x122b29);
          if (!bVar1) {
            poVar6 = std::operator<<((ostream *)&std::cout,"-----");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
        }
        llvm::
        ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
        ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                      *)in_stack_fffffffffffffa70);
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x122b76);
      if ((!bVar1) ||
         (bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                            ((opt_storage<bool,_false,_false> *)0x122b8f), bVar1)) {
        std::operator<<((ostream *)&std::cout,"Total elapsed time:\n");
        local_3e0 = &local_2d8;
        local_3e8._M_current =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
              *)std::
                vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                ::begin((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                         *)in_stack_fffffffffffffa68);
        local_3f0 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                     *)std::
                       vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                       ::end((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                              *)in_stack_fffffffffffffa68);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
                                   *)in_stack_fffffffffffffa70,
                                  (__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
                                   *)in_stack_fffffffffffffa68), bVar1) {
          local_3f8 = __gnu_cxx::
                      __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
                      ::operator*(&local_3e8);
          in_stack_fffffffffffffa90 = std::operator<<((ostream *)&std::cout,"  ");
          p_Var5 = std::
                   get<0ul,std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>
                             ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                               *)0x122c3d);
          poVar6 = std::operator<<(in_stack_fffffffffffffa90,(string *)p_Var5);
          poVar6 = std::operator<<(poVar6,": ");
          p_Var7 = std::
                   get<2ul,std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>
                             ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                               *)0x122c6b);
          local_55c = (float)*p_Var7;
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_55c / 1e+06);
          in_stack_fffffffffffffa88 = std::operator<<(poVar6," s (");
          p_Var7 = std::
                   get<2ul,std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>
                             ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                               *)0x122ce4);
          poVar6 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffa88,*p_Var7);
          poVar6 = std::operator<<(poVar6," ticks)");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          __gnu_cxx::
          __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
          ::operator++(&local_3e8);
        }
      }
      bVar1 = llvm::cl::opt_storage::operator_cast_to_bool
                        ((opt_storage<bool,_false,_false> *)0x122d36);
      if (bVar1) {
        std::operator<<((ostream *)&std::cout,"\n ==== Comparison ====\n");
        local_400 = std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::operator*
                              ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
                               in_stack_fffffffffffffa70);
        local_408.NodePtr = (node_pointer)llvm::Module::begin(in_stack_fffffffffffffa68);
        local_410.NodePtr = (node_pointer)llvm::Module::end(in_stack_fffffffffffffa68);
        while (bVar1 = llvm::operator!=(&local_408,&local_410), bVar1) {
          local_418 = llvm::
                      ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                      ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                                   *)0x122dd2);
          uVar8 = llvm::GlobalValue::isDeclaration();
          if ((uVar8 & 1) == 0) {
            std::
            vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
            ::vector((vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                      *)0x122dff);
            std::
            vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
            ::size(&local_2d8);
            std::
            vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
            ::resize((vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                      *)in_stack_fffffffffffffa90,(size_type)in_stack_fffffffffffffa88);
            local_434 = 0;
            local_440 = &local_2d8;
            local_448._M_current =
                 (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                  *)std::
                    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                    ::begin((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                             *)in_stack_fffffffffffffa68);
            local_450 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                         *)std::
                           vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                           ::end((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                                  *)in_stack_fffffffffffffa68);
            while (bVar1 = __gnu_cxx::operator!=
                                     ((__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
                                       *)in_stack_fffffffffffffa70,
                                      (__normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
                                       *)in_stack_fffffffffffffa68), bVar1) {
              local_458 = __gnu_cxx::
                          __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
                          ::operator*(&local_448);
              std::
              get<1ul,std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>
                        ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                          *)0x122ea1);
              local_460 = std::
                          unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                          ::get((unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>
                                 *)0x122ea9);
              local_468 = local_418;
              local_470.NodePtr =
                   (node_pointer)llvm::Function::begin((Function *)in_stack_fffffffffffffa68);
              local_478.NodePtr =
                   (node_pointer)llvm::Function::end((Function *)in_stack_fffffffffffffa68);
              while (bVar1 = llvm::operator!=(&local_470,&local_478), bVar1) {
                local_480 = llvm::
                            ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                            ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                                         *)0x122f16);
                dg::LLVMControlDependenceAnalysis::getDependencies
                          (in_stack_fffffffffffffa78,(BasicBlock *)in_stack_fffffffffffffa70);
                local_488 = local_4a0;
                local_4a8._M_current =
                     (Value **)
                     std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::begin
                               ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                                in_stack_fffffffffffffa68);
                std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end
                          ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                           in_stack_fffffffffffffa68);
                while (bVar1 = __gnu_cxx::operator!=
                                         ((__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                                           *)in_stack_fffffffffffffa70,
                                          (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                                           *)in_stack_fffffffffffffa68), bVar1) {
                  __gnu_cxx::
                  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                  ::operator*(&local_4a8);
                  std::
                  vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                  ::operator[](&local_430,(ulong)local_434);
                  std::
                  set<std::pair<llvm::Value_const*,llvm::Value_const*>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                  ::emplace<llvm::Value*&,llvm::BasicBlock*>
                            ((set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>
                              *)in_stack_fffffffffffffa90,(Value **)in_stack_fffffffffffffa88,
                             (BasicBlock **)in_stack_fffffffffffffa80);
                  __gnu_cxx::
                  __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                  ::operator++(&local_4a8);
                }
                local_29c = 0x10;
                std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~vector
                          (in_stack_fffffffffffffa80);
                in_stack_fffffffffffffb20 =
                     llvm::BasicBlock::begin((BasicBlock *)in_stack_fffffffffffffa68);
                in_stack_fffffffffffffb18 =
                     llvm::BasicBlock::end((BasicBlock *)in_stack_fffffffffffffa68);
                while (bVar1 = llvm::operator!=((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                                 *)&stack0xfffffffffffffb20,
                                                (ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                                 *)&stack0xfffffffffffffb18), bVar1) {
                  in_stack_fffffffffffffb10 =
                       llvm::
                       ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                       ::operator*((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                    *)0x123084);
                  dg::LLVMControlDependenceAnalysis::getDependencies
                            (in_stack_fffffffffffffa78,(Instruction *)in_stack_fffffffffffffa70);
                  in_stack_fffffffffffffb08 = local_510;
                  std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::begin
                            ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                             in_stack_fffffffffffffa68);
                  std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::end
                            ((vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                             in_stack_fffffffffffffa68);
                  while (bVar1 = __gnu_cxx::operator!=
                                           ((__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                                             *)in_stack_fffffffffffffa70,
                                            (__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                                             *)in_stack_fffffffffffffa68), bVar1) {
                    __gnu_cxx::
                    __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                    ::operator*((__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                                 *)&stack0xfffffffffffffae8);
                    std::
                    vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                    ::operator[](&local_430,(ulong)local_434);
                    std::
                    set<std::pair<llvm::Value_const*,llvm::Value_const*>,std::less<std::pair<llvm::Value_const*,llvm::Value_const*>>,std::allocator<std::pair<llvm::Value_const*,llvm::Value_const*>>>
                    ::emplace<llvm::Value*&,llvm::Instruction*>
                              ((set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>
                                *)in_stack_fffffffffffffa90,(Value **)in_stack_fffffffffffffa88,
                               (Instruction **)in_stack_fffffffffffffa80);
                    __gnu_cxx::
                    __normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                    ::operator++((__normal_iterator<llvm::Value_**,_std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>_>
                                  *)&stack0xfffffffffffffae8);
                  }
                  local_29c = 0x14;
                  std::vector<llvm::Value_*,_std::allocator<llvm::Value_*>_>::~vector
                            (in_stack_fffffffffffffa80);
                  llvm::
                  ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                  ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Instruction,_false,_false,_void>,_false,_false>
                                *)in_stack_fffffffffffffa70);
                }
                llvm::
                ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::BasicBlock,_false,_false,_void>,_false,_false>
                              *)in_stack_fffffffffffffa70);
              }
              local_434 = local_434 + 1;
              __gnu_cxx::
              __normal_iterator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_*,_std::vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>_>
              ::operator++(&local_448);
            }
            local_434 = 0;
            while( true ) {
              in_stack_fffffffffffffa80 =
                   (vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)(ulong)local_434;
              pvVar9 = (vector<llvm::Value_*,_std::allocator<llvm::Value_*>_> *)
                       std::
                       vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                       ::size(&local_430);
              if (pvVar9 <= in_stack_fffffffffffffa80) break;
              for (local_544 = 0; local_544 < local_434; local_544 = local_544 + 1) {
                in_stack_fffffffffffffa68 =
                     (Module *)
                     std::
                     vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                     ::operator[](&local_430,(ulong)local_434);
                in_stack_fffffffffffffa70 =
                     (SlicerOptions *)
                     std::
                     vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                     ::operator[](&local_430,(ulong)local_544);
                std::
                vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                ::operator[](&local_2d8,(ulong)local_434);
                in_stack_fffffffffffffa78 =
                     (LLVMControlDependenceAnalysis *)
                     std::
                     get<0ul,std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>
                               ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                                 *)0x12325e);
                std::
                vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                ::operator[](&local_2d8,(ulong)local_544);
                std::
                get<0ul,std::__cxx11::string,std::unique_ptr<dg::LLVMControlDependenceAnalysis,std::default_delete<dg::LLVMControlDependenceAnalysis>>,unsigned_long>
                          ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>
                            *)0x12327e);
                compareResults((set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>
                                *)in_stack_fffffffffffffb20.NodePtr,
                               (set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>
                                *)in_stack_fffffffffffffb18.NodePtr,
                               (string *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                               in_stack_fffffffffffffb00);
              }
              local_434 = local_434 + 1;
            }
            std::
            vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
            ::~vector((vector<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>,_std::allocator<std::set<std::pair<const_llvm::Value_*,_const_llvm::Value_*>,_std::less<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>,_std::allocator<std::pair<const_llvm::Value_*,_const_llvm::Value_*>_>_>_>_>
                       *)in_stack_fffffffffffffa80);
          }
          llvm::
          ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
          ::operator++((ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                        *)in_stack_fffffffffffffa70);
        }
      }
      local_4 = 0;
      local_29c = 1;
      std::
      vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
      ::~vector((vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<dg::LLVMControlDependenceAnalysis,_std::default_delete<dg::LLVMControlDependenceAnalysis>_>,_unsigned_long>_>_>
                 *)in_stack_fffffffffffffa80);
    }
  }
  else {
    local_4 = 1;
    local_29c = 1;
  }
  std::unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_>::~unique_ptr
            ((unique_ptr<llvm::Module,_std::default_delete<llvm::Module>_> *)
             in_stack_fffffffffffffa70);
  llvm::LLVMContext::~LLVMContext((LLVMContext *)&local_290);
  SlicerOptions::~SlicerOptions(in_stack_fffffffffffffa70);
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    setupStackTraceOnError(argc, argv);
    SlicerOptions options = parseSlicerOptions(argc, argv);

    if (enable_debug) {
        DBG_ENABLE();
    }

    if (total_only) {
        quiet = true;
    }

    llvm::LLVMContext context;
    std::unique_ptr<llvm::Module> M =
            parseModule("llvm-cda-bench", context, options);
    if (!M)
        return 1;

    if (fun_info_only) {
        for (auto &F : *M) {
            if (F.isDeclaration()) {
                continue;
            }

            dumpFunStats(F);
        }
        return 0;
    }

    std::vector<
            std::tuple<std::string,
                       std::unique_ptr<LLVMControlDependenceAnalysis>, size_t>>
            analyses;

    clock_t start, end, elapsed;
    auto &opts = options.dgOptions.CDAOptions;
    if (scd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::STANDARD;
        analyses.emplace_back("scd", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD;
        analyses.emplace_back("ntscd", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd2) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD2;
        analyses.emplace_back("ntscd2", createAnalysis(M.get(), opts), 0);
    }
    if (ntscd_ranganath) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                NTSCD_RANGANATH;
        analyses.emplace_back("ntscd-ranganath", createAnalysis(M.get(), opts),
                              0);
    }
    if (ntscd_ranganath_wrong) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                NTSCD_RANGANATH_ORIG;
        analyses.emplace_back("ntscd-ranganath-wrong",
                              createAnalysis(M.get(), opts), 0);
    }
    if (ntscd_legacy) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::NTSCD_LEGACY;
        analyses.emplace_back("ntscd-legacy", createAnalysis(M.get(), opts), 0);
    }
    if (dod) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::DOD;
        analyses.emplace_back("dod", createAnalysis(M.get(), opts), 0);
    }
    if (dod_ranganath) {
        opts.algorithm = dg::ControlDependenceAnalysisOptions::CDAlgorithm::
                DOD_RANGANATH;
        analyses.emplace_back("dod-ranganath", createAnalysis(M.get(), opts),
                              0);
    }
    if (dod_ntscd) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::DODNTSCD;
        analyses.emplace_back("dod+ntscd", createAnalysis(M.get(), opts), 0);
    }
    if (scc) {
        opts.algorithm =
                dg::ControlDependenceAnalysisOptions::CDAlgorithm::STRONG_CC;
        analyses.emplace_back("scc", createAnalysis(M.get(), opts), 0);
    }

    if (analyses.empty()) {
        std::cerr << "Warning: No analysis to run specified, "
                     "dumping just info about funs\n";
    }

    for (auto &F : *M) {
        if (F.isDeclaration()) {
            continue;
        }

        if (!quiet) {
            dumpFunStats(F);
            std::cout << "Elapsed time: \n";
        }

        for (auto &it : analyses) {
            start = clock();
            std::get<1>(it)->compute(&F); // compute all the information
            end = clock();
            elapsed = end - start;
            std::get<2>(it) += elapsed;
            if (!quiet) {
                std::cout << "  " << std::get<0>(it) << ": "
                          << static_cast<float>(elapsed) / CLOCKS_PER_SEC
                          << " s (" << elapsed << " ticks)\n";
            }
        }
        if (!quiet) {
            std::cout << "-----" << std::endl;
        }
    }

    if (!quiet || total_only) {
        std::cout << "Total elapsed time:\n";
        for (auto &it : analyses) {
            std::cout << "  " << std::get<0>(it) << ": "
                      << static_cast<float>(std::get<2>(it)) / CLOCKS_PER_SEC
                      << " s (" << std::get<2>(it) << " ticks)" << std::endl;
        }
    }

    // compare the results if requested
    if (!compare)
        return 0;

    std::cout << "\n ==== Comparison ====\n";
    for (auto &F : *M) {
        if (F.isDeclaration()) {
            continue;
        }

        // not very efficient...
        std::vector<
                std::set<std::pair<const llvm::Value *, const llvm::Value *>>>
                results;
        results.resize(analyses.size());
        unsigned n = 0;
        for (auto &it : analyses) {
            auto *cda = std::get<1>(it).get();
            for (auto &B : F) {
                for (auto *d : cda->getDependencies(&B)) {
                    results[n].emplace(d, &B);
                }

                for (auto &I : B) {
                    for (auto *d : cda->getDependencies(&I)) {
                        results[n].emplace(d, &I);
                    }
                }
            }

            ++n;
        }

        for (n = 0; n < results.size(); ++n) {
            for (unsigned m = 0; m < n; ++m) {
                compareResults(results[n], results[m], std::get<0>(analyses[n]),
                               std::get<0>(analyses[m]), F);
            }
        }
    }

    return 0;
}